

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

fiobj_object_vtable_s * fiobj_type_vtable(FIOBJ o)

{
  fiobj_type_enum fVar1;
  fiobj_object_vtable_s *pfVar2;
  
  fVar1 = fiobj_type(o);
  switch(fVar1) {
  case FIOBJ_T_FLOAT:
    pfVar2 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case FIOBJ_T_STRING:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case FIOBJ_T_ARRAY:
    pfVar2 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case FIOBJ_T_HASH:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case FIOBJ_T_DATA:
    pfVar2 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    if (fVar1 == FIOBJ_T_NUMBER) {
      return &FIOBJECT_VTABLE_NUMBER;
    }
  case FIOBJ_T_FALSE:
  case FIOBJ_T_UNKNOWN:
    pfVar2 = (fiobj_object_vtable_s *)0x0;
  }
  return pfVar2;
}

Assistant:

FIO_INLINE const fiobj_object_vtable_s *fiobj_type_vtable(FIOBJ o) {
  switch (FIOBJ_TYPE(o)) {
  case FIOBJ_T_NUMBER:
    return &FIOBJECT_VTABLE_NUMBER;
  case FIOBJ_T_FLOAT:
    return &FIOBJECT_VTABLE_FLOAT;
  case FIOBJ_T_STRING:
    return &FIOBJECT_VTABLE_STRING;
  case FIOBJ_T_ARRAY:
    return &FIOBJECT_VTABLE_ARRAY;
  case FIOBJ_T_HASH:
    return &FIOBJECT_VTABLE_HASH;
  case FIOBJ_T_DATA:
    return &FIOBJECT_VTABLE_DATA;
  case FIOBJ_T_NULL:
  case FIOBJ_T_TRUE:
  case FIOBJ_T_FALSE:
  case FIOBJ_T_UNKNOWN:
    return NULL;
  }
  return NULL;
}